

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O0

DdNode * cuddZddProduct(DdManager *dd,DdNode *f,DdNode *g)

{
  int iVar1;
  int id;
  DdNode *pDVar2;
  DdNode *n;
  DdNode *n_00;
  int nv;
  int pv;
  int flag;
  DdNode *zero;
  DdNode *one;
  DdNode *r;
  DdNode *N1;
  DdNode *N0;
  DdNode *Rd;
  DdNode *R1;
  DdNode *R0;
  DdNode *gd;
  DdNode *g1;
  DdNode *g0;
  DdNode *fd;
  DdNode *f1;
  DdNode *f0;
  DdNode *term3;
  DdNode *term2;
  DdNode *term1;
  DdNode *tmp;
  int local_30;
  int top_g;
  int top_f;
  int v;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)dd->zero;
  if (((((DdManager *)f != dd_local) && ((DdManager *)g != dd_local)) &&
      (dd_local = (DdManager *)g, f != dd->one)) && (dd_local = (DdManager *)f, g != dd->one)) {
    local_30 = dd->permZ[f->index];
    tmp._4_4_ = dd->permZ[g->index];
    _top_f = g;
    g_local = f;
    f_local = &dd->sentinel;
    if (tmp._4_4_ < local_30) {
      dd_local = (DdManager *)cuddZddProduct(dd,g,f);
    }
    else {
      dd_local = (DdManager *)cuddCacheLookup2Zdd(dd,cuddZddProduct,f,g);
      if (dd_local == (DdManager *)0x0) {
        top_g = g_local->index;
        iVar1 = cuddZddGetCofactors3((DdManager *)f_local,g_local,top_g,&fd,&f1,&g0);
        if (iVar1 == 1) {
          dd_local = (DdManager *)0x0;
        }
        else {
          Cudd_Ref(fd);
          Cudd_Ref(f1);
          Cudd_Ref(g0);
          iVar1 = cuddZddGetCofactors3((DdManager *)f_local,_top_f,top_g,&gd,&g1,&R0);
          if (iVar1 == 1) {
            Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
            dd_local = (DdManager *)0x0;
          }
          else {
            Cudd_Ref(gd);
            Cudd_Ref(g1);
            Cudd_Ref(R0);
            iVar1 = cuddZddGetPosVarIndex((DdManager *)f_local,top_g);
            id = cuddZddGetNegVarIndex((DdManager *)f_local,top_g);
            pDVar2 = cuddZddProduct((DdManager *)f_local,g0,R0);
            if (pDVar2 == (DdNode *)0x0) {
              Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,g1);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,R0);
              dd_local = (DdManager *)0x0;
            }
            else {
              Cudd_Ref(pDVar2);
              term2 = cuddZddProduct((DdManager *)f_local,f1,g1);
              if (term2 == (DdNode *)0x0) {
                Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,g1);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,R0);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
                dd_local = (DdManager *)0x0;
              }
              else {
                Cudd_Ref(term2);
                term3 = cuddZddProduct((DdManager *)f_local,f1,R0);
                if (term3 == (DdNode *)0x0) {
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,g1);
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,R0);
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,term2);
                  dd_local = (DdManager *)0x0;
                }
                else {
                  Cudd_Ref(term3);
                  f0 = cuddZddProduct((DdManager *)f_local,g0,g1);
                  if (f0 == (DdNode *)0x0) {
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,g1);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,R0);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,term2);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,term3);
                    dd_local = (DdManager *)0x0;
                  }
                  else {
                    Cudd_Ref(f0);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,g1);
                    term1 = cuddZddUnion((DdManager *)f_local,term2,term3);
                    if (term1 == (DdNode *)0x0) {
                      Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
                      Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                      Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
                      Cudd_RecursiveDerefZdd((DdManager *)f_local,R0);
                      Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
                      Cudd_RecursiveDerefZdd((DdManager *)f_local,term2);
                      Cudd_RecursiveDerefZdd((DdManager *)f_local,term3);
                      Cudd_RecursiveDerefZdd((DdManager *)f_local,f0);
                      dd_local = (DdManager *)0x0;
                    }
                    else {
                      Cudd_Ref(term1);
                      Cudd_RecursiveDerefZdd((DdManager *)f_local,term2);
                      Cudd_RecursiveDerefZdd((DdManager *)f_local,term3);
                      n = cuddZddUnion((DdManager *)f_local,term1,f0);
                      if (n == (DdNode *)0x0) {
                        Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
                        Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                        Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
                        Cudd_RecursiveDerefZdd((DdManager *)f_local,R0);
                        Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
                        Cudd_RecursiveDerefZdd((DdManager *)f_local,f0);
                        Cudd_RecursiveDerefZdd((DdManager *)f_local,term1);
                        dd_local = (DdManager *)0x0;
                      }
                      else {
                        Cudd_Ref(n);
                        Cudd_RecursiveDerefZdd((DdManager *)f_local,term1);
                        Cudd_RecursiveDerefZdd((DdManager *)f_local,f0);
                        n_00 = cuddZddGetNode((DdManager *)f_local,id,n,pDVar2);
                        if (n_00 == (DdNode *)0x0) {
                          Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
                          Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                          Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
                          Cudd_RecursiveDerefZdd((DdManager *)f_local,R0);
                          Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
                          Cudd_RecursiveDerefZdd((DdManager *)f_local,n);
                          dd_local = (DdManager *)0x0;
                        }
                        else {
                          Cudd_Ref(n_00);
                          Cudd_RecursiveDerefZdd((DdManager *)f_local,n);
                          Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
                          term2 = cuddZddProduct((DdManager *)f_local,fd,gd);
                          if (term2 == (DdNode *)0x0) {
                            Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
                            Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                            Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
                            Cudd_RecursiveDerefZdd((DdManager *)f_local,R0);
                            Cudd_RecursiveDerefZdd((DdManager *)f_local,n_00);
                            dd_local = (DdManager *)0x0;
                          }
                          else {
                            Cudd_Ref(term2);
                            term3 = cuddZddProduct((DdManager *)f_local,fd,R0);
                            if (term3 == (DdNode *)0x0) {
                              Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
                              Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                              Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
                              Cudd_RecursiveDerefZdd((DdManager *)f_local,R0);
                              Cudd_RecursiveDerefZdd((DdManager *)f_local,n_00);
                              Cudd_RecursiveDerefZdd((DdManager *)f_local,term2);
                              dd_local = (DdManager *)0x0;
                            }
                            else {
                              Cudd_Ref(term3);
                              f0 = cuddZddProduct((DdManager *)f_local,g0,gd);
                              if (f0 == (DdNode *)0x0) {
                                Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
                                Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                                Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
                                Cudd_RecursiveDerefZdd((DdManager *)f_local,R0);
                                Cudd_RecursiveDerefZdd((DdManager *)f_local,n_00);
                                Cudd_RecursiveDerefZdd((DdManager *)f_local,term2);
                                Cudd_RecursiveDerefZdd((DdManager *)f_local,term3);
                                dd_local = (DdManager *)0x0;
                              }
                              else {
                                Cudd_Ref(f0);
                                Cudd_RecursiveDerefZdd((DdManager *)f_local,fd);
                                Cudd_RecursiveDerefZdd((DdManager *)f_local,gd);
                                Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                                Cudd_RecursiveDerefZdd((DdManager *)f_local,R0);
                                term1 = cuddZddUnion((DdManager *)f_local,term2,term3);
                                if (term1 == (DdNode *)0x0) {
                                  Cudd_RecursiveDerefZdd((DdManager *)f_local,n_00);
                                  Cudd_RecursiveDerefZdd((DdManager *)f_local,term2);
                                  Cudd_RecursiveDerefZdd((DdManager *)f_local,term3);
                                  Cudd_RecursiveDerefZdd((DdManager *)f_local,f0);
                                  dd_local = (DdManager *)0x0;
                                }
                                else {
                                  Cudd_Ref(term1);
                                  Cudd_RecursiveDerefZdd((DdManager *)f_local,term2);
                                  Cudd_RecursiveDerefZdd((DdManager *)f_local,term3);
                                  pDVar2 = cuddZddUnion((DdManager *)f_local,term1,f0);
                                  if (pDVar2 == (DdNode *)0x0) {
                                    Cudd_RecursiveDerefZdd((DdManager *)f_local,n_00);
                                    Cudd_RecursiveDerefZdd((DdManager *)f_local,f0);
                                    Cudd_RecursiveDerefZdd((DdManager *)f_local,term1);
                                    dd_local = (DdManager *)0x0;
                                  }
                                  else {
                                    Cudd_Ref(pDVar2);
                                    Cudd_RecursiveDerefZdd((DdManager *)f_local,term1);
                                    Cudd_RecursiveDerefZdd((DdManager *)f_local,f0);
                                    dd_local = (DdManager *)
                                               cuddZddGetNode((DdManager *)f_local,iVar1,pDVar2,n_00
                                                             );
                                    if (dd_local == (DdManager *)0x0) {
                                      Cudd_RecursiveDerefZdd((DdManager *)f_local,n_00);
                                      Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
                                      dd_local = (DdManager *)0x0;
                                    }
                                    else {
                                      Cudd_Ref((DdNode *)dd_local);
                                      Cudd_RecursiveDerefZdd((DdManager *)f_local,pDVar2);
                                      Cudd_RecursiveDerefZdd((DdManager *)f_local,n_00);
                                      cuddCacheInsert2((DdManager *)f_local,cuddZddProduct,g_local,
                                                       _top_f,(DdNode *)dd_local);
                                      Cudd_Deref((DdNode *)dd_local);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode  *
cuddZddProduct(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    int         v, top_f, top_g;
    DdNode      *tmp, *term1, *term2, *term3;
    DdNode      *f0, *f1, *fd, *g0, *g1, *gd;
    DdNode      *R0, *R1, *Rd, *N0, *N1;
    DdNode      *r;
    DdNode      *one = DD_ONE(dd);
    DdNode      *zero = DD_ZERO(dd);
    int         flag;
    int         pv, nv;

    statLine(dd);
    if (f == zero || g == zero)
        return(zero);
    if (f == one)
        return(g);
    if (g == one)
        return(f);

    top_f = dd->permZ[f->index];
    top_g = dd->permZ[g->index];

    if (top_f > top_g)
        return(cuddZddProduct(dd, g, f));

    /* Check cache */
    r = cuddCacheLookup2Zdd(dd, cuddZddProduct, f, g);
    if (r)
        return(r);

    v = f->index;       /* either yi or zi */
    flag = cuddZddGetCofactors3(dd, f, v, &f1, &f0, &fd);
    if (flag == 1)
        return(NULL);
    Cudd_Ref(f1);
    Cudd_Ref(f0);
    Cudd_Ref(fd);
    flag = cuddZddGetCofactors3(dd, g, v, &g1, &g0, &gd);
    if (flag == 1) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, fd);
        return(NULL);
    }
    Cudd_Ref(g1);
    Cudd_Ref(g0);
    Cudd_Ref(gd);
    pv = cuddZddGetPosVarIndex(dd, v);
    nv = cuddZddGetNegVarIndex(dd, v);

    Rd = cuddZddProduct(dd, fd, gd);
    if (Rd == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, g0);
        Cudd_RecursiveDerefZdd(dd, gd);
        return(NULL);
    }
    Cudd_Ref(Rd);

    term1 = cuddZddProduct(dd, f0, g0);
    if (term1 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, g0);
        Cudd_RecursiveDerefZdd(dd, gd);
        Cudd_RecursiveDerefZdd(dd, Rd);
        return(NULL);
    }
    Cudd_Ref(term1);
    term2 = cuddZddProduct(dd, f0, gd);
    if (term2 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, g0);
        Cudd_RecursiveDerefZdd(dd, gd);
        Cudd_RecursiveDerefZdd(dd, Rd);
        Cudd_RecursiveDerefZdd(dd, term1);
        return(NULL);
    }
    Cudd_Ref(term2);
    term3 = cuddZddProduct(dd, fd, g0);
    if (term3 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, g0);
        Cudd_RecursiveDerefZdd(dd, gd);
        Cudd_RecursiveDerefZdd(dd, Rd);
        Cudd_RecursiveDerefZdd(dd, term1);
        Cudd_RecursiveDerefZdd(dd, term2);
        return(NULL);
    }
    Cudd_Ref(term3);
    Cudd_RecursiveDerefZdd(dd, f0);
    Cudd_RecursiveDerefZdd(dd, g0);
    tmp = cuddZddUnion(dd, term1, term2);
    if (tmp == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, gd);
        Cudd_RecursiveDerefZdd(dd, Rd);
        Cudd_RecursiveDerefZdd(dd, term1);
        Cudd_RecursiveDerefZdd(dd, term2);
        Cudd_RecursiveDerefZdd(dd, term3);
        return(NULL);
    }
    Cudd_Ref(tmp);
    Cudd_RecursiveDerefZdd(dd, term1);
    Cudd_RecursiveDerefZdd(dd, term2);
    R0 = cuddZddUnion(dd, tmp, term3);
    if (R0 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, gd);
        Cudd_RecursiveDerefZdd(dd, Rd);
        Cudd_RecursiveDerefZdd(dd, term3);
        Cudd_RecursiveDerefZdd(dd, tmp);
        return(NULL);
    }
    Cudd_Ref(R0);
    Cudd_RecursiveDerefZdd(dd, tmp);
    Cudd_RecursiveDerefZdd(dd, term3);
    N0 = cuddZddGetNode(dd, nv, R0, Rd); /* nv = zi */
    if (N0 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, gd);
        Cudd_RecursiveDerefZdd(dd, Rd);
        Cudd_RecursiveDerefZdd(dd, R0);
        return(NULL);
    }
    Cudd_Ref(N0);
    Cudd_RecursiveDerefZdd(dd, R0);
    Cudd_RecursiveDerefZdd(dd, Rd);

    term1 = cuddZddProduct(dd, f1, g1);
    if (term1 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, gd);
        Cudd_RecursiveDerefZdd(dd, N0);
        return(NULL);
    }
    Cudd_Ref(term1);
    term2 = cuddZddProduct(dd, f1, gd);
    if (term2 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, gd);
        Cudd_RecursiveDerefZdd(dd, N0);
        Cudd_RecursiveDerefZdd(dd, term1);
        return(NULL);
    }
    Cudd_Ref(term2);
    term3 = cuddZddProduct(dd, fd, g1);
    if (term3 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, fd);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, gd);
        Cudd_RecursiveDerefZdd(dd, N0);
        Cudd_RecursiveDerefZdd(dd, term1);
        Cudd_RecursiveDerefZdd(dd, term2);
        return(NULL);
    }
    Cudd_Ref(term3);
    Cudd_RecursiveDerefZdd(dd, f1);
    Cudd_RecursiveDerefZdd(dd, g1);
    Cudd_RecursiveDerefZdd(dd, fd);
    Cudd_RecursiveDerefZdd(dd, gd);
    tmp = cuddZddUnion(dd, term1, term2);
    if (tmp == NULL) {
        Cudd_RecursiveDerefZdd(dd, N0);
        Cudd_RecursiveDerefZdd(dd, term1);
        Cudd_RecursiveDerefZdd(dd, term2);
        Cudd_RecursiveDerefZdd(dd, term3);
        return(NULL);
    }
    Cudd_Ref(tmp);
    Cudd_RecursiveDerefZdd(dd, term1);
    Cudd_RecursiveDerefZdd(dd, term2);
    R1 = cuddZddUnion(dd, tmp, term3);
    if (R1 == NULL) {
        Cudd_RecursiveDerefZdd(dd, N0);
        Cudd_RecursiveDerefZdd(dd, term3);
        Cudd_RecursiveDerefZdd(dd, tmp);
        return(NULL);
    }
    Cudd_Ref(R1);
    Cudd_RecursiveDerefZdd(dd, tmp);
    Cudd_RecursiveDerefZdd(dd, term3);
    N1 = cuddZddGetNode(dd, pv, R1, N0); /* pv = yi */
    if (N1 == NULL) {
        Cudd_RecursiveDerefZdd(dd, N0);
        Cudd_RecursiveDerefZdd(dd, R1);
        return(NULL);
    }
    Cudd_Ref(N1);
    Cudd_RecursiveDerefZdd(dd, R1);
    Cudd_RecursiveDerefZdd(dd, N0);

    cuddCacheInsert2(dd, cuddZddProduct, f, g, N1);
    Cudd_Deref(N1);
    return(N1);

}